

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O2

bool __thiscall
sptk::reaper::EpochTracker::GetLpcResidual
          (EpochTracker *this,vector<float,_std::allocator<float>_> *input,float sample_rate,
          vector<float,_std::allocator<float>_> *output)

{
  pointer pfVar1;
  bool bVar2;
  int32_t i;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  float *lpca;
  float *lpca_00;
  void *pvVar7;
  ulong uVar8;
  int iVar9;
  uint lpc_ord;
  long lVar10;
  int iVar11;
  ulong uVar12;
  int wsize;
  long lVar13;
  float *pfVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  int local_ac;
  float preemp_rms;
  float norm_error;
  vector<float,_std::allocator<float>_> *local_88;
  long local_80;
  ulong local_78;
  long local_70;
  LpcAnalyzer lp;
  
  uVar4 = (uint)((long)(input->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(input->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start >> 2);
  if (((int)uVar4 < 1) ||
     (output == (vector<float,_std::allocator<float>_> *)0x0 || sample_rate <= 0.0)) {
LAB_0010b856:
    bVar2 = false;
  }
  else {
    local_88 = output;
    std::vector<float,_std::allocator<float>_>::resize(output,(ulong)(uVar4 & 0x7fffffff));
    iVar9 = (int)(this->lpc_frame_interval_ * sample_rate + 0.5);
    wsize = (int)(this->frame_duration_ * sample_rate + 0.5);
    iVar3 = (int)(uVar4 - wsize) / iVar9;
    if ((int)uVar4 < iVar3 * iVar9 + wsize) {
      iVar3 = iVar3 + 1;
    }
    else if (iVar3 < 1) goto LAB_0010b856;
    lp.window_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    lp.window_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    lp.energywind_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    lp.window_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    lpc_ord = (uint)(sample_rate / 1000.0 + 2.5);
    lp.energywind_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    lp.energywind_.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    uVar4 = lpc_ord + 1;
    uVar12 = 0xffffffffffffffff;
    if (-2 < (int)lpc_ord) {
      uVar12 = (long)(int)uVar4 << 2;
    }
    lpca = (float *)operator_new__(uVar12);
    lpca_00 = (float *)operator_new__(uVar12);
    pvVar7 = operator_new__(uVar12);
    norm_error = 0.0;
    preemp_rms = 0.0;
    iVar5 = LpcAnalyzer::ComputeLpc
                      (&lp,lpc_ord,this->noise_floor_,wsize,
                       (input->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start,lpca_00,(float *)0x0,(float *)0x0,
                       &norm_error,&preemp_rms,this->preemphasis_);
    if (iVar5 == 0) {
      bVar2 = false;
    }
    else {
      for (lVar10 = 0; lVar10 <= (int)lpc_ord; lVar10 = lVar10 + 1) {
        *(undefined4 *)((long)pvVar7 + lVar10 * 4) = 0;
        (local_88->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_start[lVar10] = 0.0;
      }
      fVar16 = LpcDcGain(lpca_00,lpc_ord);
      lVar10 = 0;
      if ((int)uVar4 < 1) {
        uVar4 = 0;
      }
      local_78 = (ulong)uVar4;
      local_80 = (long)iVar9;
      local_ac = 0;
      uVar12 = (ulong)lpc_ord;
      iVar5 = wsize / 2 - lpc_ord;
      for (; bVar2 = iVar3 < 1, 0 < iVar3; iVar3 = iVar3 + -1) {
        local_70 = lVar10;
        iVar6 = LpcAnalyzer::ComputeLpc
                          (&lp,lpc_ord,this->noise_floor_,wsize,
                           (input->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar10,lpca,(float *)0x0,(float *)0x0,
                           &norm_error,&preemp_rms,this->preemphasis_);
        if (iVar6 == 0) break;
        fVar17 = LpcDcGain(lpca,lpc_ord);
        for (uVar8 = 0; local_78 != uVar8; uVar8 = uVar8 + 1) {
          *(float *)((long)pvVar7 + uVar8 * 4) = (lpca[uVar8] - lpca_00[uVar8]) / (float)iVar5;
        }
        fVar17 = fVar17 - fVar16;
        pfVar1 = (input->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        iVar11 = 0;
        iVar6 = iVar5;
        if (iVar5 < 1) {
          iVar6 = 0;
        }
        uVar12 = (ulong)(int)uVar12;
        lVar13 = (long)local_ac << 0x20;
        lVar10 = (long)local_ac << 2;
        for (; iVar11 != iVar6; iVar11 = iVar11 + 1) {
          pfVar14 = (float *)((long)(input->super__Vector_base<float,_std::allocator<float>_>).
                                    _M_impl.super__Vector_impl_data._M_start + lVar10);
          fVar18 = 0.0;
          lVar15 = lVar13;
          for (uVar8 = (ulong)lpc_ord; 0 < (int)uVar8; uVar8 = uVar8 - 1) {
            fVar18 = fVar18 + *pfVar14 * lpca_00[uVar8];
            lpca_00[uVar8] = lpca_00[uVar8] + *(float *)((long)pvVar7 + uVar8 * 4);
            lVar15 = lVar15 + 0x100000000;
            pfVar14 = pfVar14 + 1;
          }
          (local_88->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar12] =
               (fVar18 + *(float *)((long)pfVar1 + (lVar15 >> 0x1e))) / fVar16;
          fVar16 = fVar16 + fVar17 / (float)iVar5;
          uVar12 = uVar12 + 1;
          lVar13 = lVar13 + 0x100000000;
          lVar10 = lVar10 + 4;
        }
        local_ac = local_ac + iVar6;
        lVar10 = local_70 + local_80;
        iVar5 = iVar9;
      }
    }
    operator_delete__(lpca);
    operator_delete__(lpca_00);
    operator_delete__(pvVar7);
    LpcAnalyzer::~LpcAnalyzer(&lp);
  }
  return bVar2;
}

Assistant:

bool EpochTracker::GetLpcResidual(const std::vector<float>& input, float sample_rate,
                                  std::vector<float>* output) {
  int32_t n_input = input.size();
  if (!((n_input > 0) && (sample_rate > 0.0) && output)) {
    return false;
  }
  output->resize(n_input);
  int32_t frame_step = RoundUp(sample_rate * lpc_frame_interval_);
  int32_t frame_size = RoundUp(sample_rate * frame_duration_);
  int32_t n_frames = 1 + ((n_input - frame_size) / frame_step);
  int32_t n_analyzed = ((n_frames - 1) * frame_step) + frame_size;
  // Must have one more than frame size to do a complete frame.
  if (n_analyzed <= n_input) {
    n_frames--;
    if (n_frames <= 0) {
      return false;
    }
  }
  LpcAnalyzer lp;
  int32_t order = lp.GetLpcOrder(sample_rate);
  float* lpc = new float[order + 1];
  float* old_lpc = new float[order + 1];
  float* delta_lpc = new float[order + 1];
  float norm_error = 0.0;
  float preemp_rms = 0.0;

#define  RELEASE_MEMORY() {                     \
    delete [] lpc;                              \
    delete [] old_lpc;                          \
    delete [] delta_lpc;                        \
  }

  if (!lp.ComputeLpc(order, noise_floor_, frame_size, &(input.front()),
                     old_lpc, NULL, NULL, &norm_error, &preemp_rms,
                     preemphasis_)) {
    RELEASE_MEMORY();
    return false;
  }
  for (int32_t i = 0; i <= order; ++i) {
    delta_lpc[i] = 0.0;
    (*output)[i] = 0.0;
  }
  float old_gain = LpcDcGain(old_lpc, order);
  float new_gain = 1.0;
  int32_t n_to_filter = (frame_size / 2) - order;  // How many samples
  // to process before
  // computing the next
  // LPC frame.
  int32_t input_p = 0;  // Where to get the next frame for LPC analysis
  int32_t output_p = order;  // where to store output samples.
  int32_t proc_p = 0;  // Where to pick up samples for input to the filter

  // Main processing loop:
  // Compute a new frame of LPC
  // Compute the DC gain for the new LPC
  // Compute delta DC gain.
  // Compute the LPC deltas.
  // For each point in the frame:
  //   Use old_lpc to produce an output point.
  //   Update the old LPCs and the DC gain
  // As soon as the center of the current frame is reached, compute
  // the LPC for the next frame.
  for ( ; n_frames > 0; --n_frames, input_p += frame_step,
            n_to_filter = frame_step) {
    if (!lp.ComputeLpc(order, noise_floor_, frame_size,
                       (&(input.front())) + input_p, lpc, NULL, NULL,
                       &norm_error, &preemp_rms, preemphasis_)) {
      RELEASE_MEMORY();
      return false;
    }
    new_gain = LpcDcGain(lpc, order);
    float delta_gain = (new_gain - old_gain) / n_to_filter;
    MakeDeltas(old_lpc, lpc, order+1, n_to_filter, delta_lpc);
    for (int32_t sample = 0; sample < n_to_filter; ++sample, ++proc_p,
             ++output_p) {
      float sum = 0.0;
      int32_t mem = proc_p;
      for (int32_t k = order; k > 0; --k, ++mem) {
        sum += (old_lpc[k] * input[mem]);
        old_lpc[k] += delta_lpc[k];
      }
      sum += input[mem];  // lpc[0] is always 1.0
      (*output)[output_p] = sum / old_gain;
      old_gain += delta_gain;
    }
  }
  RELEASE_MEMORY();
  return true;
}